

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  U32 offBase;
  seqDef *psVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  U32 UVar12;
  U32 offBase_00;
  U32 UVar13;
  BYTE *op;
  ulong uVar14;
  uint ll0;
  size_t err_code;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  repcodes_t dRepOriginal;
  
  dRepOriginal.rep[2] = dRep->rep[2];
  dRepOriginal.rep._0_8_ = *(undefined8 *)dRep->rep;
  if (isPartition != 0) {
    uVar9 = (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3;
    uVar10 = (uint)uVar9;
    if (seqStore->longLengthType == ZSTD_llt_literalLength) {
      uVar10 = seqStore->longLengthPos;
    }
    for (uVar14 = 0; (uVar9 & 0xffffffff) != uVar14; uVar14 = uVar14 + 1) {
      psVar6 = seqStore->sequencesStart;
      ll0 = (uint)(uVar10 != uVar14 && psVar6[uVar14].litLength == 0);
      offBase = psVar6[uVar14].offBase;
      offBase_00 = offBase;
      if (offBase - 1 < 3) {
        uVar11 = (offBase - 1) + ll0;
        if (uVar11 == 3) {
          UVar13 = dRep->rep[0] - 1;
          UVar12 = cRep->rep[0] - 1;
        }
        else {
          UVar13 = dRep->rep[uVar11];
          UVar12 = cRep->rep[uVar11];
        }
        if (UVar13 != UVar12) {
          offBase_00 = UVar12 + 3;
          psVar6[uVar14].offBase = offBase_00;
        }
      }
      ZSTD_updateRep(dRep->rep,offBase_00,ll0);
      ZSTD_updateRep(cRep->rep,offBase,ll0);
    }
  }
  uVar9 = 0xffffffffffffffba;
  if (2 < dstCapacity) {
    uVar9 = ZSTD_entropyCompressSeqStore
                      (seqStore,&((zc->blockState).prevCBlock)->entropy,
                       &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                       (void *)((long)dst + 3),dstCapacity - 3,srcSize,zc->entropyWorkspace,
                       (ulong)(uint)zc->bmi2,-0x46);
    if (uVar9 < 0xffffffffffffff89) {
      if ((uVar9 < 0x19) && (zc->isFirstBlock == 0)) {
        iVar8 = ZSTD_isRLE((BYTE *)src,srcSize);
        if (iVar8 != 0) {
          uVar9 = 1;
        }
      }
      if ((zc->seqCollector).collectSequences == 0) {
        if (uVar9 == 1) {
          if (dstCapacity == 3) {
            return 0xffffffffffffffba;
          }
          uVar5 = *src;
          iVar8 = lastBlock + (int)srcSize * 8 + 2;
          *(short *)dst = (short)iVar8;
          *(char *)((long)dst + 2) = (char)((uint)iVar8 >> 0x10);
          *(undefined1 *)((long)dst + 3) = uVar5;
          dRep->rep[2] = dRepOriginal.rep[2];
          *(undefined8 *)dRep->rep = dRepOriginal.rep._0_8_;
          uVar9 = 4;
        }
        else if (uVar9 == 0) {
          uVar9 = srcSize + 3;
          if (dstCapacity < uVar9) {
            return 0xffffffffffffffba;
          }
          iVar8 = lastBlock + (int)srcSize * 8;
          *(short *)dst = (short)iVar8;
          *(char *)((long)dst + 2) = (char)((uint)iVar8 >> 0x10);
          switchD_00916250::default((void *)((long)dst + 3),src,srcSize);
          if (0xffffffffffffff88 < uVar9) {
            return uVar9;
          }
          dRep->rep[2] = dRepOriginal.rep[2];
          *(undefined8 *)dRep->rep = dRepOriginal.rep._0_8_;
        }
        else {
          uVar2 = (zc->blockState).prevCBlock;
          uVar4 = (zc->blockState).nextCBlock;
          auVar16._8_4_ = (int)uVar2;
          auVar16._0_8_ = uVar4;
          auVar16._12_4_ = (int)((ulong)uVar2 >> 0x20);
          (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar4;
          (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar16._8_8_;
          iVar8 = lastBlock + (int)uVar9 * 8 + 4;
          *(short *)dst = (short)iVar8;
          *(char *)((long)dst + 2) = (char)((uint)iVar8 >> 0x10);
          uVar9 = uVar9 + 3;
        }
        pZVar7 = (zc->blockState).prevCBlock;
        if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
      }
      else {
        uVar9 = ZSTD_copyBlockSequences(&zc->seqCollector,seqStore,dRepOriginal.rep);
        if (uVar9 < 0xffffffffffffff89) {
          uVar1 = (zc->blockState).prevCBlock;
          uVar3 = (zc->blockState).nextCBlock;
          auVar15._8_4_ = (int)uVar1;
          auVar15._0_8_ = uVar3;
          auVar15._12_4_ = (int)((ulong)uVar1 >> 0x20);
          (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
          (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar15._8_8_;
          uVar9 = 0;
        }
      }
    }
  }
  return uVar9;
}

Assistant:

static size_t
ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc,
                            const seqStore_t* const seqStore,
                                  repcodes_t* const dRep, repcodes_t* const cRep,
                                  void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize,
                                  U32 lastBlock, U32 isPartition)
{
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    DEBUGLOG(5, "ZSTD_compressSeqStore_singleBlock");
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize, dstSize_tooSmall, "Block header doesn't fit");
    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    /* Sequence collection not supported when block splitting */
    if (zc->seqCollector.collectSequences) {
        FORWARD_IF_ERROR(ZSTD_copyBlockSequences(&zc->seqCollector, seqStore, dRepOriginal.rep), "copyBlockSequences failed");
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}